

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RingDecomposerLib.c
# Opt level: O0

uint RDL_getNofNodesForRingsystem(RDL_data *data,uint idx)

{
  uint idx_local;
  RDL_data *data_local;
  
  if (data == (RDL_data *)0x0) {
    (*RDL_outputFunc)(RDL_ERROR,"RDL_data is NULL!\n");
    data_local._4_4_ = 0xffffffff;
  }
  else if (idx < data->bccGraphs->nof_bcc) {
    data_local._4_4_ = data->bccGraphs->bcc_graphs[idx]->V;
  }
  else {
    (*RDL_outputFunc)(RDL_ERROR,"idx %d is out of range!\n",(ulong)idx);
    data_local._4_4_ = 0xffffffff;
  }
  return data_local._4_4_;
}

Assistant:

unsigned RDL_getNofNodesForRingsystem(const RDL_data *data, unsigned idx)
{
  if (!data) {
    RDL_outputFunc(RDL_ERROR, "RDL_data is NULL!\n");
    return RDL_INVALID_RESULT;
  }

  if(idx >= data->bccGraphs->nof_bcc) {
    RDL_outputFunc(RDL_ERROR, "idx %d is out of range!\n", idx);
    return RDL_INVALID_RESULT;
  }

  return data->bccGraphs->bcc_graphs[idx]->V;
}